

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_font_bake_pack(nk_font_baker *baker,nk_size *image_memory,int *width,int *height,
                     nk_recti *custom,nk_font_config *config_list,int count,nk_allocator *alloc)

{
  nk_font_config *pnVar1;
  int iVar2;
  nk_uint nVar3;
  nk_font_bake_data *info;
  nk_rune *pnVar4;
  bool bVar5;
  int local_ac;
  int local_a4;
  nk_font_bake_data *tmp;
  nk_font_config *cfg_1;
  nk_rune *in_range;
  int glyph_count;
  int n;
  nk_rp_rect custom_space;
  int char_n;
  int rect_n;
  int range_n;
  int input_i;
  nk_font_config *cfg;
  int i;
  int range_count;
  int total_range_count;
  int total_glyph_count;
  nk_font_config *config_iter;
  nk_font_config *config_list_local;
  nk_recti *custom_local;
  int *height_local;
  int *width_local;
  nk_size *image_memory_local;
  nk_font_baker *baker_local;
  
  range_count = 0;
  i = 0;
  cfg._0_4_ = 0;
  if (image_memory == (nk_size *)0x0) {
    __assert_fail("image_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x274c,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if (width == (int *)0x0) {
    __assert_fail("width",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x274d,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if (height == (int *)0x0) {
    __assert_fail("height",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x274e,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if (config_list == (nk_font_config *)0x0) {
    __assert_fail("config_list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x274f,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if (count == 0) {
    __assert_fail("count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2750,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if (alloc == (nk_allocator *)0x0) {
    __assert_fail("alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2751,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  if ((((image_memory == (nk_size *)0x0) || (width == (int *)0x0)) || (height == (int *)0x0)) ||
     ((config_list == (nk_font_config *)0x0 || (_total_range_count = config_list, count == 0)))) {
    baker_local._4_4_ = 0;
  }
  else {
    for (; pnVar1 = config_list, _total_range_count != (nk_font_config *)0x0;
        _total_range_count = _total_range_count->next) {
      iVar2 = nk_range_count(_total_range_count->range);
      i = iVar2 + i;
      iVar2 = nk_range_glyph_count(_total_range_count->range,iVar2);
      range_count = iVar2 + range_count;
    }
    while (_total_range_count = pnVar1, _total_range_count != (nk_font_config *)0x0) {
      iVar2 = nk_tt_InitFont(&baker->build[(int)cfg].info,(uchar *)_total_range_count->ttf_blob,0);
      if (iVar2 == 0) {
        return 0;
      }
      cfg._0_4_ = (int)cfg + 1;
      pnVar1 = _total_range_count->next;
    }
    *height = 0;
    iVar2 = 0x200;
    if (1000 < range_count) {
      iVar2 = 0x400;
    }
    *width = iVar2;
    nk_tt_PackBegin(&baker->spc,(uchar *)0x0,*width,0x8000,0,1,alloc);
    char_n = 0;
    custom_space.was_packed = 0;
    custom_space.x = 0;
    custom_space.y = 0;
    if (custom != (nk_recti *)0x0) {
      nk_zero(&glyph_count,0x10);
      n._0_2_ = custom->w * 2 + 1;
      n._2_2_ = custom->h + 1;
      nk_tt_PackSetOversampling(&baker->spc,1,1);
      nk_rp_pack_rects((nk_rp_context *)(baker->spc).pack_info,(nk_rp_rect *)&glyph_count,1);
      if (*height < (int)((uint)custom_space.id._2_2_ + (uint)n._2_2_)) {
        local_a4 = (uint)custom_space.id._2_2_ + (uint)n._2_2_;
      }
      else {
        local_a4 = *height;
      }
      *height = local_a4;
      custom->x = (short)custom_space.id;
      custom->y = custom_space.id._2_2_;
      custom->w = (short)n;
      custom->h = n._2_2_;
    }
    _total_range_count = config_list;
    for (rect_n = 0; rect_n < count && _total_range_count != (nk_font_config *)0x0;
        rect_n = rect_n + 1) {
      info = baker->build + rect_n;
      in_range._0_4_ = 0;
      cfg._4_4_ = 0;
      cfg_1 = (nk_font_config *)_total_range_count->range;
      while( true ) {
        bVar5 = false;
        if (*(int *)&cfg_1->next != 0) {
          bVar5 = *(int *)((long)&cfg_1->next + 4) != 0;
        }
        if (!bVar5) break;
        in_range._0_4_ =
             (*(int *)((long)&cfg_1->next + 4) - *(int *)&cfg_1->next) + 1 + (int)in_range;
        cfg._4_4_ = cfg._4_4_ + 1;
        cfg_1 = (nk_font_config *)&cfg_1->ttf_blob;
      }
      info->ranges = baker->ranges + char_n;
      info->range_count = cfg._4_4_;
      char_n = cfg._4_4_ + char_n;
      for (cfg._0_4_ = 0; (int)cfg < (int)cfg._4_4_; cfg._0_4_ = (int)cfg + 1) {
        pnVar4 = _total_range_count->range + ((int)cfg << 1);
        info->ranges[(int)cfg].font_size = _total_range_count->size;
        info->ranges[(int)cfg].first_unicode_codepoint_in_range = *pnVar4;
        info->ranges[(int)cfg].num_chars = (pnVar4[1] - *pnVar4) + 1;
        info->ranges[(int)cfg].chardata_for_range = baker->packed_chars + (int)custom_space._8_4_;
        custom_space._8_4_ = info->ranges[(int)cfg].num_chars + custom_space._8_4_;
      }
      info->rects = baker->rects + custom_space.was_packed;
      custom_space.was_packed = (int)in_range + custom_space.was_packed;
      nk_tt_PackSetOversampling
                (&baker->spc,(uint)_total_range_count->oversample_h,
                 (uint)_total_range_count->oversample_v);
      iVar2 = nk_tt_PackFontRangesGatherRects
                        (&baker->spc,&info->info,info->ranges,info->range_count,info->rects);
      nk_rp_pack_rects((nk_rp_context *)(baker->spc).pack_info,info->rects,iVar2);
      for (cfg._0_4_ = 0; (int)cfg < iVar2; cfg._0_4_ = (int)cfg + 1) {
        if (info->rects[(int)cfg].was_packed != 0) {
          if (*height < (int)((uint)info->rects[(int)cfg].y + (uint)info->rects[(int)cfg].h)) {
            local_ac = (uint)info->rects[(int)cfg].y + (uint)info->rects[(int)cfg].h;
          }
          else {
            local_ac = *height;
          }
          *height = local_ac;
        }
      }
      _total_range_count = _total_range_count->next;
    }
    if (custom_space.was_packed != range_count) {
      __assert_fail("rect_n == total_glyph_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x27a7,
                    "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                   );
    }
    if (custom_space._8_4_ != range_count) {
      __assert_fail("char_n == total_glyph_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x27a8,
                    "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                   );
    }
    if (char_n != i) {
      __assert_fail("range_n == total_range_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x27a9,
                    "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                   );
    }
    nVar3 = nk_round_up_pow2(*height);
    *height = nVar3;
    *image_memory = (long)*width * (long)*height;
    baker_local._4_4_ = 1;
  }
  return baker_local._4_4_;
}

Assistant:

NK_INTERN int
nk_font_bake_pack(struct nk_font_baker *baker,
    nk_size *image_memory, int *width, int *height, struct nk_recti *custom,
    const struct nk_font_config *config_list, int count,
    struct nk_allocator *alloc)
{
    NK_STORAGE const nk_size max_height = 1024 * 32;
    const struct nk_font_config *config_iter;
    int total_glyph_count = 0;
    int total_range_count = 0;
    int range_count = 0;
    int i = 0;

    NK_ASSERT(image_memory);
    NK_ASSERT(width);
    NK_ASSERT(height);
    NK_ASSERT(config_list);
    NK_ASSERT(count);
    NK_ASSERT(alloc);

    if (!image_memory || !width || !height || !config_list || !count) return nk_false;
    for (config_iter = config_list; config_iter; config_iter = config_iter->next) {
        range_count = nk_range_count(config_iter->range);
        total_range_count += range_count;
        total_glyph_count += nk_range_glyph_count(config_iter->range, range_count);
    }

    /* setup font baker from temporary memory */
    for (config_iter = config_list; config_iter; config_iter = config_iter->next) {
        const struct nk_font_config *cfg = config_iter;
        if (!nk_tt_InitFont(&baker->build[i++].info, (const unsigned char*)cfg->ttf_blob, 0))
            return nk_false;
    }

    *height = 0;
    *width = (total_glyph_count > 1000) ? 1024 : 512;
    nk_tt_PackBegin(&baker->spc, 0, (int)*width, (int)max_height, 0, 1, alloc);
    {
        int input_i = 0;
        int range_n = 0;
        int rect_n = 0;
        int char_n = 0;

        /* pack custom user data first so it will be in the upper left corner*/
        if (custom) {
            struct nk_rp_rect custom_space;
            nk_zero(&custom_space, sizeof(custom_space));
            custom_space.w = (nk_rp_coord)((custom->w * 2) + 1);
            custom_space.h = (nk_rp_coord)(custom->h + 1);

            nk_tt_PackSetOversampling(&baker->spc, 1, 1);
            nk_rp_pack_rects((struct nk_rp_context*)baker->spc.pack_info, &custom_space, 1);
            *height = NK_MAX(*height, (int)(custom_space.y + custom_space.h));

            custom->x = (short)custom_space.x;
            custom->y = (short)custom_space.y;
            custom->w = (short)custom_space.w;
            custom->h = (short)custom_space.h;
        }

        /* first font pass: pack all glyphs */
        for (input_i = 0, config_iter = config_list; input_i < count && config_iter;
            input_i++, config_iter = config_iter->next)
        {
            int n = 0;
            int glyph_count;
            const nk_rune *in_range;
            const struct nk_font_config *cfg = config_iter;
            struct nk_font_bake_data *tmp = &baker->build[input_i];

            /* count glyphs + ranges in current font */
            glyph_count = 0; range_count = 0;
            for (in_range = cfg->range; in_range[0] && in_range[1]; in_range += 2) {
                glyph_count += (int)(in_range[1] - in_range[0]) + 1;
                range_count++;
            }

            /* setup ranges  */
            tmp->ranges = baker->ranges + range_n;
            tmp->range_count = (nk_rune)range_count;
            range_n += range_count;
            for (i = 0; i < range_count; ++i) {
                in_range = &cfg->range[i * 2];
                tmp->ranges[i].font_size = cfg->size;
                tmp->ranges[i].first_unicode_codepoint_in_range = (int)in_range[0];
                tmp->ranges[i].num_chars = (int)(in_range[1]- in_range[0]) + 1;
                tmp->ranges[i].chardata_for_range = baker->packed_chars + char_n;
                char_n += tmp->ranges[i].num_chars;
            }

            /* pack */
            tmp->rects = baker->rects + rect_n;
            rect_n += glyph_count;
            nk_tt_PackSetOversampling(&baker->spc, cfg->oversample_h, cfg->oversample_v);
            n = nk_tt_PackFontRangesGatherRects(&baker->spc, &tmp->info,
                tmp->ranges, (int)tmp->range_count, tmp->rects);
            nk_rp_pack_rects((struct nk_rp_context*)baker->spc.pack_info, tmp->rects, (int)n);

            /* texture height */
            for (i = 0; i < n; ++i) {
                if (tmp->rects[i].was_packed)
                    *height = NK_MAX(*height, tmp->rects[i].y + tmp->rects[i].h);
            }
        }
        NK_ASSERT(rect_n == total_glyph_count);
        NK_ASSERT(char_n == total_glyph_count);
        NK_ASSERT(range_n == total_range_count);
    }
    *height = (int)nk_round_up_pow2((nk_uint)*height);
    *image_memory = (nk_size)(*width) * (nk_size)(*height);
    return nk_true;
}